

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTestCase.cpp
# Opt level: O2

void __thiscall SuiteDictionaryTests::TestsetGetInt::~TestsetGetInt(TestsetGetInt *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(setGetInt)
{
  Dictionary object;
  object.setInt( "INTKEY1", 12 );
  object.setInt( "INTKEY2", 9827362 );
  object.setString( "BADINTKEY", "AB12" );

  CHECK_EQUAL( 12, object.getInt( "INTKEY1" ) );
  CHECK_EQUAL( 9827362, object.getInt( "INTKEY2" ) );
  CHECK_THROW( object.getInt( "INTKEY3" ), ConfigError );
  CHECK_THROW( object.getInt( "BADINTKEY" ), ConfigError );
}